

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_font.cpp
# Opt level: O2

void __thiscall ON_ManagedFonts::~ON_ManagedFonts(ON_ManagedFonts *this)

{
  ON_Font *this_00;
  ulong uVar1;
  ON_SimpleArray<const_ON_Font_*> managed_fonts;
  ON_SimpleArray<const_ON_Font_*> local_48;
  
  ON_SimpleArray<const_ON_Font_*>::ON_SimpleArray(&local_48,&(this->m_installed_fonts).m_by_index);
  ON_SimpleArray<const_ON_Font_*>::Append
            (&local_48,(this->m_managed_fonts).m_by_index.m_count,
             (this->m_managed_fonts).m_by_index.m_a);
  ON_FontList::Internal_EmptyLists(&this->m_installed_fonts);
  ON_FontList::Internal_EmptyLists(&this->m_managed_fonts);
  for (uVar1 = (ulong)(uint)local_48.m_count; 0 < (int)uVar1; uVar1 = uVar1 - 1) {
    this_00 = local_48.m_a[uVar1 - 1];
    if ((this_00 != (ON_Font *)0x0) && ((ON_Font *)this->m_default_font_ptr != this_00)) {
      if (this_00->m_runtime_serial_number == 1) {
        ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_font.cpp"
                   ,0x2b8,"",
                   "The m_default_font_ptr test above should have detected ON_Font::Default.");
      }
      else {
        std::__shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>::reset
                  (&(this_00->m_font_glyph_cache).
                    super___shared_ptr<ON_FontGlyphCache,_(__gnu_cxx::_Lock_policy)2>);
        ON_Font::~ON_Font(this_00);
        operator_delete(this_00,0xc0);
      }
    }
  }
  ON_SimpleArray<const_ON_Font_*>::~ON_SimpleArray(&local_48);
  ON_FontList::~ON_FontList(&this->m_installed_fonts);
  ON_FontList::~ON_FontList(&this->m_managed_fonts);
  return;
}

Assistant:

ON_ManagedFonts::~ON_ManagedFonts()
{

  ON_SimpleArray<const ON_Font*> managed_fonts(m_installed_fonts.m_by_index);
  managed_fonts.Append(m_managed_fonts.m_by_index.Count(),m_managed_fonts.m_by_index.Array());

  m_installed_fonts.Internal_EmptyLists();
  m_managed_fonts.Internal_EmptyLists();

  // last created first deleted - it shouldn't really matter.
  for(int i = managed_fonts.Count()-1; i >= 0; i--)
  {
    ON_Font* managed_font = const_cast<ON_Font*>(managed_fonts[i]);
    if (nullptr == managed_font)
      continue;

    if (m_default_font_ptr == (ON__UINT_PTR)managed_font)
    {
      // ON_Font::Default is constructed after ON_ManagedFonts::List 
      // and destructed before the destruction of ON_ManagedFonts::List.
      // This continue prevents calling delete on 
      continue;
    }
    if (1 == managed_font->m_runtime_serial_number)
    {
      // ON_Font::Default.m_runtime_serial_number = 1 and it is the only instance of a font
      // with m_runtime_serial_number = 1.  
      // However, the managed_font pointer points to ON_Font::Default, which was destroyed a few milliseconds ago.
      // See opennurbs_statics.cpp and observe that construction order is
      // ..., ON_ManagedFonts::List, ON_Font::Unset, ON_Font::Default, ...
      // and destruction order is
      // ..., ON_Font::Default, ON_Font::Unset, ON_ManagedFonts::List, ...
      ON_ERROR("The m_default_font_ptr test above should have detected ON_Font::Default.");
      continue;
    }

    // The reset needs to happen for all fonts, including ON_Font::Default
    // Otherwise we get unpredictable crashes when closing because the
    // order in which ON_Font::Default, ON_GlyphMap::GlyphPool and ON_ManagedFonts::List
    // is not predictable.
    managed_font->m_font_glyph_cache.reset();


    delete managed_font;
  }
}